

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O0

string * __thiscall
phpconvert::ZendParser::generateAlias
          (string *__return_storage_ptr__,ZendParser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *type,uint parts)

{
  uint uVar1;
  size_type sVar2;
  reference pvVar3;
  ulong uVar4;
  uint local_3c;
  uint start;
  uint limit;
  allocator local_25;
  uint local_24;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_20;
  uint parts_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *type_local;
  ZendParser *this_local;
  string *alias;
  
  local_24 = parts;
  pvStack_20 = type;
  type_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  this_local = (ZendParser *)__return_storage_ptr__;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(type);
  if (sVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_25);
    std::allocator<char>::~allocator((allocator<char> *)&local_25);
  }
  else {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(pvStack_20);
    if (sVar2 == 1) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvStack_20,0);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar3);
    }
    else {
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvStack_20);
      uVar1 = (int)sVar2 - 1;
      local_3c = uVar1 - (local_24 - 1);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      if ((local_24 == 0) ||
         (uVar4 = (ulong)local_24,
         sVar2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(pvStack_20), sVar2 <= uVar4)) {
        local_3c = 0;
      }
      for (; local_3c <= uVar1; local_3c = local_3c + 1) {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](pvStack_20,(ulong)local_3c);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)pvVar3);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string ZendParser::generateAlias(vector<string> &type, unsigned int parts) {
        if (type.size() <= 0)
            return "";
        if (type.size() == 1)
            return type[0];

        unsigned int limit = type.size() - 1;
        unsigned int start = limit - (parts - 1);
        string alias;

        if (parts <= 0 || parts >= type.size())
            start = 0;

        while (start <= limit) {
            alias += type[start];
            start++;
        }
        return alias;
    }